

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O3

void crnlib::rg_etc1::pack_etc1_block_init(void)

{
  bool bVar1;
  int i;
  long lVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  int color;
  ulong uVar9;
  uint uVar10;
  bool bVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ulong local_e8;
  int aiStack_b8 [34];
  
  local_e8 = 0;
  bVar1 = true;
  do {
    lVar2 = 0;
    do {
      lVar6 = 0;
      do {
        iVar5 = (&g_etc1_inten_tables)[lVar2 * 4 + lVar6];
        uVar9 = 0;
        do {
          uVar13 = 0xffffffff;
          uVar7 = 0;
          uVar4 = 0;
          uVar15 = 0;
          uVar14 = 1;
          do {
            uVar8 = uVar14 - 1;
            if (bVar1) {
              uVar3 = uVar7 | uVar8;
            }
            else {
              uVar3 = uVar8 >> 2 | uVar4;
            }
            uVar3 = uVar3 + iVar5;
            if (0xfe < (int)uVar3) {
              uVar3 = 0xff;
            }
            if ((int)uVar3 < 1) {
              uVar3 = 0;
            }
            uVar10 = uVar3 - (int)uVar9;
            uVar12 = -uVar10;
            if (0 < (int)uVar10) {
              uVar12 = uVar10;
            }
            bVar11 = uVar12 < uVar13;
            if (bVar11) {
              uVar15 = uVar8;
              uVar13 = uVar12;
            }
            if (uVar9 == uVar3 && bVar11) break;
            uVar4 = uVar4 + 8;
            uVar7 = uVar7 + 0x10;
            bVar11 = uVar14 < (uint)(byte)~bVar1 * 0x10 + 0x10;
            uVar14 = uVar14 + 1;
          } while (bVar11);
          *(ushort *)
           (g_etc1_inverse_lookup + uVar9 * 2 + (lVar6 * 0x10 + lVar2 * 2 | local_e8) * 0x200) =
               (ushort)uVar15 | (ushort)(uVar13 << 8);
          uVar9 = uVar9 + 1;
        } while (uVar9 != 0x100);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 8);
    local_e8 = 1;
    bVar11 = !bVar1;
    bVar1 = false;
    if (bVar11) {
      uVar7 = 0;
      uVar8 = 1;
      uVar3 = 2;
      uVar12 = 3;
      lVar2 = 0;
      uVar13 = uVar7;
      uVar14 = uVar8;
      uVar15 = uVar3;
      uVar4 = uVar12;
      do {
        aiStack_b8[lVar2] = uVar13 * 8 + (uVar7 >> 2);
        aiStack_b8[lVar2 + 1] = uVar14 * 8 + (uVar8 >> 2);
        aiStack_b8[lVar2 + 2] = uVar15 * 8 + (uVar3 >> 2);
        aiStack_b8[lVar2 + 3] = uVar4 * 8 + (uVar12 >> 2);
        lVar2 = lVar2 + 4;
        uVar7 = uVar7 + 4;
        uVar8 = uVar8 + 4;
        uVar3 = uVar3 + 4;
        uVar12 = uVar12 + 4;
        uVar13 = uVar13 + 4;
        uVar14 = uVar14 + 4;
        uVar15 = uVar15 + 4;
        uVar4 = uVar4 + 4;
      } while (lVar2 != 0x20);
      lVar2 = 0;
      do {
        iVar5 = 0x107;
        if ((int)lVar2 < 0x107) {
          iVar5 = (int)lVar2;
        }
        if (iVar5 < 9) {
          iVar5 = 8;
        }
        (&g_quant5_tab)[lVar2] =
             (char)aiStack_b8[((iVar5 * 0x1f - 0x78U >> 8) + iVar5 * 0x1f) - 0x78 >> 8];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x110);
      return;
    }
  } while( true );
}

Assistant:

void pack_etc1_block_init() {
  for (uint diff = 0; diff < 2; diff++) {
    const uint limit = diff ? 32 : 16;

    for (uint inten = 0; inten < 8; inten++) {
      for (uint selector = 0; selector < 4; selector++) {
        const uint inverse_table_index = diff + (inten << 1) + (selector << 4);
        for (int color = 0; color < 256; color++) {
          uint best_error = cUINT32_MAX, best_packed_c = 0;
          for (uint packed_c = 0; packed_c < limit; packed_c++) {
            int v = etc1_decode_value(diff, inten, selector, packed_c);
            uint err = labs(v - color);
            if (err < best_error) {
              best_error = err;
              best_packed_c = packed_c;
              if (!best_error)
                break;
            }
          }
          RG_ETC1_ASSERT(best_error <= 255);
          g_etc1_inverse_lookup[inverse_table_index][color] = static_cast<uint16>(best_packed_c | (best_error << 8));
        }
      }
    }
  }

  uint expand5[32];
  for (int i = 0; i < 32; i++)
    expand5[i] = (i << 3) | (i >> 2);

  for (int i = 0; i < 256 + 16; i++) {
    int v = clamp<int>(i - 8, 0, 255);
    g_quant5_tab[i] = static_cast<uint8>(expand5[mul_8bit(v, 31)]);
  }
}